

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void genDotIntersect(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                    pointSet *dots,float probeRad,float spikelen,int srcFlag,int targFlg,
                    dotNode *(*results) [7])

{
  dotNode_t *pdVar1;
  atom *allMainAtoms_00;
  int iVar2;
  atom *paVar3;
  long lVar4;
  bool bVar5;
  FILE *dots_00;
  dotNode *pdVar6;
  dotNode *pdVar7;
  dotNode *__ptr;
  long lVar8;
  uint local_58;
  uint local_54;
  float local_50;
  uint local_4c;
  pointSet *local_48;
  atomBins *local_40;
  atom *local_38;
  
  local_50 = spikelen;
  local_48 = dots;
  local_40 = abins;
  if (Ldotdump == '\x01') {
    fwrite("entered genDotIntersect()\n",0x1a,1,_stderr);
  }
  bVar5 = bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0;
  local_4c = srcFlag;
  local_38 = allMainAtoms;
  for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
    if ((allMainAtoms->flags & srcFlag) != 0) {
      local_58 = 1;
      local_54 = local_58;
      paVar3 = findTouchingAtoms(allMainAtoms,(atom *)0x0,local_40,probeRad,targFlg,(int *)&local_58
                                );
      if (bVar5) {
        paVar3 = findTouchingAtoms(allMainAtoms,paVar3,bbins,probeRad,targFlg,(int *)&local_54);
      }
      if (Ldotdump == '\x01') {
        fprintf(_stderr,"findTouchingAtoms() sets oktargsA== %d \n",(ulong)local_58);
      }
      if ((paVar3 != (atom *)0x0) && ((local_58 != 0 || (local_54 != 0 && bVar5)))) {
        dots_00 = (FILE *)(ulong)(uint)Maxbonded;
        markBonds(allMainAtoms,paVar3,1,Maxbonded);
        if (3 < Maxbonded) {
          fixupLongBondChains(allMainAtoms,paVar3,3);
        }
        iVar2 = dotType(allMainAtoms,paVar3,0);
        allMainAtoms_00 = local_38;
        if (LOneDotEach == '\x01') {
          if (Ldotdump == '\x01') {
            dots_00 = _stderr;
            fwrite("genDotIntersect() calls examineOneDotEach()\n",0x2c,1,_stderr);
          }
          examineOneDotEach(allMainAtoms,iVar2,paVar3,(pointSet *)dots_00,probeRad,local_50,targFlg,
                            results,allMainAtoms_00);
        }
        else {
          examineDots(allMainAtoms,iVar2,paVar3,local_48,probeRad,local_50,targFlg,results);
        }
        srcFlag = local_4c;
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          fprintf(_stderr,"%s%d   \r",allMainAtoms->r->resname,(ulong)(uint)allMainAtoms->r->resid);
        }
      }
    }
  }
  if (bVar5) {
    for (; allMovingAtoms != (atom *)0x0; allMovingAtoms = allMovingAtoms->next) {
      if ((allMovingAtoms->flags & srcFlag) != 0) {
        local_58 = 1;
        local_54 = local_58;
        paVar3 = findTouchingAtoms(allMovingAtoms,(atom *)0x0,local_40,probeRad,targFlg,
                                   (int *)&local_58);
        paVar3 = findTouchingAtoms(allMovingAtoms,paVar3,bbins,probeRad,targFlg,(int *)&local_54);
        if ((paVar3 != (atom *)0x0) && (local_54 != 0 || local_58 != 0)) {
          markBonds(allMovingAtoms,paVar3,1,Maxbonded);
          if (3 < Maxbonded) {
            fixupLongBondChains(allMovingAtoms,paVar3,3);
          }
          iVar2 = dotType(allMovingAtoms,paVar3,0);
          examineDots(allMovingAtoms,iVar2,paVar3,local_48,probeRad,local_50,targFlg,results);
          if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
            fprintf(_stderr,"%s%d   \r",allMovingAtoms->r->resname,
                    (ulong)(uint)allMovingAtoms->r->resid);
          }
        }
      }
    }
  }
  lVar4 = 0;
  do {
    if (lVar4 == 0x72) {
      return;
    }
    lVar8 = 0;
LAB_0012b68f:
    if (lVar8 != 6) {
      pdVar6 = results[lVar4][lVar8];
      do {
        pdVar1 = pdVar6;
        pdVar7 = (dotNode *)0x0;
        while( true ) {
          while( true ) {
            __ptr = pdVar1;
            if (__ptr == (dotNode *)0x0) {
              results[lVar4][lVar8] = pdVar6;
              lVar8 = lVar8 + 1;
              goto LAB_0012b68f;
            }
            if (((__ptr->a->altConf == ' ') || (__ptr->t->altConf == ' ')) &&
               (__ptr->a->occ + __ptr->t->occ <= 1.0)) break;
            pdVar1 = __ptr->next;
            pdVar7 = __ptr;
          }
          pdVar1 = __ptr->next;
          if (__ptr == pdVar6) break;
          pdVar7->next = pdVar1;
          free(__ptr);
          pdVar1 = pdVar7->next;
        }
        free(__ptr);
        pdVar6 = pdVar1;
      } while( true );
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void genDotIntersect(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen,
			int srcFlag, int targFlg, dotNode *results[][NODEWIDTH])
{/*genDotIntersect()*/

   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int oktargsA = TRUE, oktargsB = TRUE;

    int i=0,j=0;/* SJ - 05/06/2015 moved the variables here from below for compatibility with windows C compiler*/ 
    atom *source = NULL, *target=NULL;
    dotNode *head = NULL, *curNode = NULL, *prevNode = NULL;

   if(Ldotdump) {
    fprintf(stderr,"entered genDotIntersect()\n");
   }

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) /*main==autobondrotstatic*/
   {/*for: loop over all main atoms taking each in turn as the src-atom*/

      if (src->flags & srcFlag)  /*dcr?: seems srcFlag always either 1 or 2 ??*/
      {/*for each src atom*/

          oktargsA = TRUE; oktargsB = TRUE;
          atomList = findTouchingAtoms(src, NULL,abins, probeRad, targFlg, &oktargsA);

           /*20111206 findTouchingAtoms() sets ~exactly overlapping atoms to be NOT oktargsA*/
           /*this is where too close things fail to show dots !! ?? */

          if (usesMovingAtoms) /*autobondrot*/
          {
	            atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	        }
	        else
          {
               atomList2 = atomList;
          }

          if(Ldotdump)
              fprintf(stderr,"findTouchingAtoms() sets oktargsA== %d \n",oktargsA);
          if (atomList2 && (oktargsA || (usesMovingAtoms && oktargsB) ))
          {
	           markBonds(src, atomList2, 1, Maxbonded); /*in genDotIntersect()*/
              /*markBonds identifies bonds between atoms - */
              /*seems not to have lower distance limit*/
              /*but this is where autobondrot fails to spike very close atoms*/

              if (Maxbonded > 3)
                   fixupLongBondChains(src, atomList2, 3);

	           type = dotType(src, atomList2, FALSE);

              if(LOneDotEach)
              {
                   if(Ldotdump)
                     fprintf(stderr,"genDotIntersect() calls examineOneDotEach()\n");
                
                   examineOneDotEach(src,type,atomList2,dots,probeRad,spikelen,targFlg,results,allMainAtoms);
                  /*allMainAtoms20120120*/
              }
              else
              {
                  examineDots(src, type, atomList2, dots, probeRad, spikelen, targFlg, results);
              }
              if(Verbose && ShowTicks)
              {
		            fprintf(stderr, "%s%d   \r",
			          src->r->resname, src->r->resid);
              }
          }
      }/*for each src atom*/
   }/*for: loop over all static atoms taking each in turn as the src-atom*/

   if(usesMovingAtoms)
   {/*if: usesMovingAtoms==autobondrot*/

      for(src = allMovingAtoms; src; src = src->next)
      {/*for: loop over allMovingAtoms taking each in turn as the src-atom*/

	       if (src->flags & srcFlag)  /*dcr?: what is being flagged here??*/
         {

	           oktargsA = TRUE;
              oktargsB = TRUE;
	           atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, targFlg, &oktargsA);
	           atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	           if (atomList2 && (oktargsA || oktargsB))
              {
	               markBonds(src, atomList2, 1, Maxbonded);
               /*markBonds identifies bonds between atoms - */
               /*seems not to have lower distance limit*/
              /*but is where autobondrot fails to spike very close atoms*/

	               if (Maxbonded > 3)
                       fixupLongBondChains(src, atomList2, 3);

                 type = dotType(src, atomList2, FALSE);

                  /*usesMovingAtoms==autobondrot does not use LOneDotEach option 111205*/
                 examineDots(src,type,atomList2,dots,probeRad,spikelen,targFlg,results);

	               if(Verbose && ShowTicks)
                 {
		                 fprintf(stderr, "%s%d   \r",
			              src->r->resname, src->r->resid);
                 }
	          }
	      }
      }/*for: loop over allMovingAtoms taking each in turn as the src-atom*/
   }/*if: usesMovingAtoms==autobondrot*/
    
    // SJ - 10/03/2014 - Code to delete contact dots (except H bonds) between atom pairs when atleast one of them has an altConf " " and the sum of their occpancies is <= 1
    // UNKNOWN BUGS: Not sure what this code will do if the results is genearted using autobondrot
    
    for(i=0;i<NUMATOMTYPES;i++)
    {/*loop over atom types*/
       // for(j=0;j<4;j++) // Old: first j:0-3 correspond to wc, cc, so, bo. Not looping over H-bond dotNode, last one is H bonds
        for(j=0; j< NODEWIDTH - 1; j++) // changed on 04/09/2015 SJ to accomodate for extra list for weak H bonds and worse overlaps
            /* see NODEWIDTH definition in probe.h - SJ*/
        {/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
            
            head = results[i][j];
            prevNode=NULL;
            curNode=head;
            while(curNode) // if the list is empty, it will not enter this loop
            {
                source = curNode->a;
                target = curNode->t;
                if((source->altConf == ' ' || target->altConf == ' ') && source->occ + target->occ <= 1)
                { //this node has to be deleted
                    if(curNode==head)
                    {
                        head=curNode->next;
                        free(curNode);
                        prevNode=NULL;
                        curNode=head;
                    }
                    else
                    {
                        prevNode->next=curNode->next;
                        free(curNode);
                        curNode=prevNode->next;
                    }
                }
                else
                {//move forward when no deletion
                    prevNode=curNode;
                    curNode=curNode->next;
                }
            }/*while loop*/
            results[i][j]=head;
        }/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
    }/*for loop over atomtypes*/
    //results now is filtered
    
}